

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::it_unknown_error(info *this,string *desc)

{
  ostream *poVar1;
  reference pvVar2;
  string local_250 [32];
  string local_230 [32];
  string local_210;
  value_type local_1f0;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *desc_local;
  info *this_local;
  
  (this->super_colored_base).super_progress_base.specs_failed_ =
       (this->super_colored_base).super_progress_base.specs_failed_ + 1;
  local_18 = desc;
  desc_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  progress_base::current_context_name_abi_cxx11_(&local_1c0,(progress_base *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,": Unknown exception");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.failures_,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  pvVar2 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  pvVar2->total = pvVar2->total + 1;
  pvVar2 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  pvVar2->failed = pvVar2->failed + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar1 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&local_210,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_230);
  poVar1 = std::operator<<(poVar1,local_230);
  poVar1 = std::operator<<(poVar1,"-ERROR->");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_250);
  poVar1 = std::operator<<(poVar1,local_250);
  poVar1 = std::operator<<(poVar1," it ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ": Unknown exception" << std::endl;
        failures_.push_back(ss.str());

        ++context_stack_.top().total;
        ++context_stack_.top().failed;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.bad()
            << "-ERROR->"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }